

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExtractor.h
# Opt level: O0

void __thiscall
llvm::DataExtractor::getU8
          (DataExtractor *this,Cursor *C,SmallVectorImpl<unsigned_char> *Dst,uint32_t Count)

{
  bool bVar1;
  pointer Dst_00;
  uint32_t Count_local;
  SmallVectorImpl<unsigned_char> *Dst_local;
  Cursor *C_local;
  DataExtractor *this_local;
  
  bVar1 = isValidOffsetForDataOfSize(this,C->Offset,(ulong)Count);
  if (bVar1) {
    SmallVectorImpl<unsigned_char>::resize(Dst,(ulong)Count);
  }
  Dst_00 = SmallVectorTemplateCommon<unsigned_char,_void>::data
                     ((SmallVectorTemplateCommon<unsigned_char,_void> *)Dst);
  getU8(this,C,Dst_00,Count);
  return;
}

Assistant:

void getU8(Cursor &C, SmallVectorImpl<uint8_t> &Dst, uint32_t Count) const {
    if (isValidOffsetForDataOfSize(C.Offset, Count))
      Dst.resize(Count);

    // This relies on the fact that getU8 will not attempt to write to the
    // buffer if isValidOffsetForDataOfSize(C.Offset, Count) is false.
    getU8(C, Dst.data(), Count);
  }